

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiContext * ImGui::CreateContext(ImFontAtlas *shared_font_atlas)

{
  ImGuiContext *ctx_00;
  ImGuiContext *this;
  ImGuiContext *ctx;
  ImGuiContext *prev_ctx;
  ImFontAtlas *shared_font_atlas_local;
  
  ctx_00 = GetCurrentContext();
  MemAlloc(0x5678);
  this = (ImGuiContext *)operator_new(0x5678);
  ImGuiContext::ImGuiContext(this,shared_font_atlas);
  SetCurrentContext(this);
  Initialize();
  if (ctx_00 != (ImGuiContext *)0x0) {
    SetCurrentContext(ctx_00);
  }
  return this;
}

Assistant:

ImGuiContext* ImGui::CreateContext(ImFontAtlas* shared_font_atlas)
{
    ImGuiContext* prev_ctx = GetCurrentContext();
    ImGuiContext* ctx = IM_NEW(ImGuiContext)(shared_font_atlas);
    SetCurrentContext(ctx);
    Initialize();
    if (prev_ctx != NULL)
        SetCurrentContext(prev_ctx); // Restore previous context if any, else keep new one.
    return ctx;
}